

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntlm.c
# Opt level: O1

CURLcode Curl_auth_create_ntlm_type3_message
                   (Curl_easy *data,char *userp,char *passwdp,ntlmdata *ntlm,bufref *out)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  ntlmdata *pnVar4;
  int iVar5;
  CURLcode CVar6;
  uint uVar7;
  char *pcVar8;
  size_t userlen;
  size_t sVar9;
  sbyte sVar10;
  ulong uVar11;
  long lVar12;
  ulong __n;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  ulong uVar17;
  uint uVar18;
  ulong __n_00;
  long lVar19;
  uint uVar20;
  uchar *puVar21;
  Curl_easy *data_00;
  bool bVar22;
  uint ntresplen;
  size_t local_940;
  ntlmdata *local_938;
  Curl_easy *local_930;
  char *local_928;
  uchar *ntlmv2resp;
  char *local_918;
  uchar entropy [8];
  uchar lmbuffer [24];
  uchar lmresp [24];
  uchar ntresp [24];
  uchar ntlmbuf [1024];
  char host [1025];
  
  ntresplen = 0x18;
  ntlmv2resp = (uchar *)0x0;
  uVar20 = ntlm->flags;
  local_930 = data;
  memset(host,0,0x401);
  pcVar8 = strchr(userp,0x5c);
  if (pcVar8 == (char *)0x0) {
    pcVar8 = strchr(userp,0x2f);
  }
  sVar16 = (long)pcVar8 - (long)userp;
  local_918 = pcVar8 + 1;
  if (pcVar8 == (char *)0x0) {
    local_918 = userp;
  }
  local_928 = userp;
  if (pcVar8 == (char *)0x0) {
    sVar16 = 0;
    local_928 = "";
  }
  userlen = strlen(local_918);
  iVar5 = Curl_gethostname(host,0x401);
  data_00 = local_930;
  if (iVar5 == 0) {
    sVar9 = strlen(host);
    data_00 = local_930;
  }
  else {
    sVar9 = 0;
    Curl_infof(local_930,"gethostname() failed, continuing without!");
  }
  local_938 = ntlm;
  if ((ntlm->flags & 0x80000) == 0) {
    CVar6 = Curl_ntlm_core_mk_nt_hash(data_00,passwdp,ntlmbuf);
    pnVar4 = local_938;
    local_940 = sVar16;
    if (CVar6 == CURLE_OK) {
      puVar21 = local_938->nonce;
      Curl_ntlm_core_lm_resp(ntlmbuf,puVar21,ntresp);
      CVar6 = Curl_ntlm_core_mk_lm_hash(data_00,passwdp,lmbuffer);
      bVar22 = CVar6 == CURLE_OK;
      if (bVar22) {
        Curl_ntlm_core_lm_resp(lmbuffer,puVar21,lmresp);
        pbVar1 = (byte *)((long)&pnVar4->flags + 2);
        *pbVar1 = *pbVar1 & 0xf7;
      }
      else {
        data_00 = (Curl_easy *)(ulong)CVar6;
      }
      CVar6 = (CURLcode)data_00;
    }
    else {
      bVar22 = false;
    }
    if (!bVar22) {
      return CVar6;
    }
    puVar21 = ntresp;
    sVar16 = local_940;
  }
  else {
    CVar6 = Curl_rand(data_00,entropy,8);
    if ((((CVar6 == CURLE_OK) &&
         (CVar6 = Curl_ntlm_core_mk_nt_hash(data_00,passwdp,ntlmbuf), CVar6 == CURLE_OK)) &&
        (CVar6 = Curl_ntlm_core_mk_ntlmv2_hash(local_918,userlen,local_928,sVar16,ntlmbuf,lmbuffer),
        pnVar4 = local_938, CVar6 == CURLE_OK)) &&
       ((CVar6 = Curl_ntlm_core_mk_lmv2_resp(lmbuffer,entropy,local_938->nonce,lmresp),
        CVar6 == CURLE_OK &&
        (CVar6 = Curl_ntlm_core_mk_ntlmv2_resp(lmbuffer,entropy,pnVar4,&ntlmv2resp,&ntresplen),
        CVar6 == CURLE_OK)))) {
      bVar22 = true;
      puVar21 = ntlmv2resp;
    }
    else {
      data_00 = (Curl_easy *)(ulong)CVar6;
      bVar22 = false;
      puVar21 = ntresp;
    }
    if (!bVar22) {
      return (CURLcode)data_00;
    }
  }
  uVar20 = uVar20 & 1;
  sVar10 = (sbyte)uVar20;
  __n_00 = sVar9 << sVar10;
  __n = userlen << sVar10;
  local_940 = sVar16 << sVar10;
  uVar2 = (uint)local_940;
  uVar18 = ntresplen + uVar2 + 0x58;
  uVar3 = (uint)__n;
  uVar14 = (ulong)(ntresplen >> 8 & 0xff);
  uVar17 = (ulong)(uVar2 >> 8 & 0xff);
  uVar13 = (ulong)(uVar3 >> 8 & 0xff);
  uVar11 = (ulong)((uint)__n_00 & 0xff);
  uVar15 = (ulong)((uint)(__n_00 >> 8) & 0xff);
  uVar7 = local_938->flags;
  uVar7 = curl_msnprintf((char *)ntlmbuf,0x400,
                         "NTLMSSP%c\x03%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c"
                         ,0,0,0,0,0x18,0,0x18,0,0x40,0,0,0,(ulong)(ntresplen & 0xff),uVar14,
                         (ulong)(ntresplen & 0xff),uVar14,0x58,0,0,0,(ulong)(uVar2 & 0xff),uVar17,
                         (ulong)(uVar2 & 0xff),uVar17,(ulong)(ntresplen + 0x58 & 0xff),
                         (ulong)(ntresplen + 0x58 >> 8 & 0xff),0,0,(ulong)(uVar3 & 0xff),uVar13,
                         (ulong)(uVar3 & 0xff),uVar13,(ulong)(uVar18 & 0xff),
                         (ulong)(uVar18 >> 8 & 0xff),0,0,uVar11,uVar15,uVar11,uVar15,
                         (ulong)(uVar18 + uVar3 & 0xff),(ulong)(uVar18 + uVar3 >> 8 & 0xff),0,0,0,0,
                         0,0,0,0,0,0,(ulong)(uVar7 & 0xff),(ulong)(uVar7 >> 8 & 0xff),
                         (ulong)(uVar7 >> 0x10 & 0xff),(ulong)(uVar7 >> 0x18));
  sVar16 = local_940;
  lVar19 = (long)(int)uVar7;
  if (uVar7 < 1000) {
    *(undefined8 *)(ntlmbuf + lVar19 + 0x10) = lmresp._16_8_;
    *(undefined8 *)(ntlmbuf + lVar19) = lmresp._0_8_;
    *(undefined8 *)(ntlmbuf + lVar19 + 8) = lmresp._8_8_;
    lVar19 = lVar19 + 0x18;
  }
  uVar11 = (ulong)ntresplen;
  uVar14 = lVar19 + uVar11;
  if (uVar14 < 0x401) {
    memcpy(ntlmbuf + lVar19,puVar21,uVar11);
    (*Curl_cfree)(ntlmv2resp);
    if (__n_00 + uVar14 + __n + sVar16 < 0x400) {
      if (uVar20 == 0) {
        memcpy(ntlmbuf + uVar14,local_928,sVar16);
      }
      else if (sVar16 != 0) {
        uVar13 = 0;
        do {
          ntlmbuf[uVar13 * 2 + uVar14] = local_928[uVar13];
          ntlmbuf[uVar13 * 2 + uVar14 + 1] = '\0';
          uVar13 = uVar13 + 1;
        } while (sVar16 >> 1 != uVar13);
      }
      if (uVar20 == 0) {
        memcpy(ntlmbuf + uVar14 + sVar16,local_918,__n);
      }
      else if (__n != 0) {
        lVar12 = lVar19 + sVar16 + uVar11;
        uVar13 = 0;
        do {
          ntlmbuf[uVar13 * 2 + lVar12] = local_918[uVar13];
          ntlmbuf[uVar13 * 2 + lVar12 + 1] = '\0';
          uVar13 = uVar13 + 1;
        } while (__n >> 1 != uVar13);
      }
      lVar12 = uVar14 + sVar16 + __n;
      if (uVar20 == 0) {
        memcpy(ntlmbuf + lVar12,host,__n_00);
      }
      else if (__n_00 != 0) {
        lVar19 = lVar19 + sVar16 + __n + uVar11;
        uVar14 = 0;
        do {
          ntlmbuf[uVar14 * 2 + lVar19] = host[uVar14];
          ntlmbuf[uVar14 * 2 + lVar19 + 1] = '\0';
          uVar14 = uVar14 + 1;
        } while (__n_00 >> 1 != uVar14);
      }
      CVar6 = Curl_bufref_memdup(out,ntlmbuf,lVar12 + __n_00);
      pnVar4 = local_938;
      (*Curl_cfree)(local_938->target_info);
      pnVar4->target_info = (void *)0x0;
      pnVar4->target_info_len = 0;
      return CVar6;
    }
    pcVar8 = "user + domain + host name too big";
  }
  else {
    pcVar8 = "incoming NTLM message too big";
  }
  Curl_failf(local_930,pcVar8);
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

CURLcode Curl_auth_create_ntlm_type3_message(struct Curl_easy *data,
                                             const char *userp,
                                             const char *passwdp,
                                             struct ntlmdata *ntlm,
                                             struct bufref *out)
{
  /* NTLM type-3 message structure:

          Index  Description            Content
            0    NTLMSSP Signature      Null-terminated ASCII "NTLMSSP"
                                        (0x4e544c4d53535000)
            8    NTLM Message Type      long (0x03000000)
           12    LM/LMv2 Response       security buffer
           20    NTLM/NTLMv2 Response   security buffer
           28    Target Name            security buffer
           36    User Name              security buffer
           44    Workstation Name       security buffer
          (52)   Session Key            security buffer (*)
          (60)   Flags                  long (*)
          (64)   OS Version Structure   8 bytes (*)
  52 (64) (72)   Start of data block
                                          (*) -> Optional
  */

  CURLcode result = CURLE_OK;
  size_t size;
  unsigned char ntlmbuf[NTLM_BUFSIZE];
  int lmrespoff;
  unsigned char lmresp[24]; /* fixed-size */
#ifdef USE_NTRESPONSES
  int ntrespoff;
  unsigned int ntresplen = 24;
  unsigned char ntresp[24]; /* fixed-size */
  unsigned char *ptr_ntresp = &ntresp[0];
  unsigned char *ntlmv2resp = NULL;
#endif
  bool unicode = (ntlm->flags & NTLMFLAG_NEGOTIATE_UNICODE) ? TRUE : FALSE;
  char host[HOSTNAME_MAX + 1] = "";
  const char *user;
  const char *domain = "";
  size_t hostoff = 0;
  size_t useroff = 0;
  size_t domoff = 0;
  size_t hostlen = 0;
  size_t userlen = 0;
  size_t domlen = 0;

  user = strchr(userp, '\\');
  if(!user)
    user = strchr(userp, '/');

  if(user) {
    domain = userp;
    domlen = (user - domain);
    user++;
  }
  else
    user = userp;

  userlen = strlen(user);

  /* Get the machine's un-qualified host name as NTLM doesn't like the fully
     qualified domain name */
  if(Curl_gethostname(host, sizeof(host))) {
    infof(data, "gethostname() failed, continuing without!");
    hostlen = 0;
  }
  else {
    hostlen = strlen(host);
  }

#if defined(USE_NTRESPONSES) && \
    (defined(USE_NTLM2SESSION) || defined(USE_NTLM_V2))
  /* We don't support NTLM2 or extended security if we don't have
     USE_NTRESPONSES */
  if(ntlm->flags & NTLMFLAG_NEGOTIATE_NTLM2_KEY) {
# if defined(USE_NTLM_V2)
    unsigned char ntbuffer[0x18];
    unsigned char entropy[8];
    unsigned char ntlmv2hash[0x18];

    /* Full NTLM version 2
       Although this cannot be negotiated, it is used here if available, as
       servers featuring extended security are likely supporting also
       NTLMv2. */
    result = Curl_rand(data, entropy, 8);
    if(result)
      return result;

    result = Curl_ntlm_core_mk_nt_hash(data, passwdp, ntbuffer);
    if(result)
      return result;

    result = Curl_ntlm_core_mk_ntlmv2_hash(user, userlen, domain, domlen,
                                           ntbuffer, ntlmv2hash);
    if(result)
      return result;

    /* LMv2 response */
    result = Curl_ntlm_core_mk_lmv2_resp(ntlmv2hash, entropy,
                                         &ntlm->nonce[0], lmresp);
    if(result)
      return result;

    /* NTLMv2 response */
    result = Curl_ntlm_core_mk_ntlmv2_resp(ntlmv2hash, entropy,
                                           ntlm, &ntlmv2resp, &ntresplen);
    if(result)
      return result;

    ptr_ntresp = ntlmv2resp;
# else /* defined(USE_NTLM_V2) */
    unsigned char ntbuffer[0x18];
    unsigned char tmp[0x18];
    unsigned char md5sum[MD5_DIGEST_LEN];
    unsigned char entropy[8];

    /* NTLM version 1 with extended security. */

    /* Need to create 8 bytes random data */
    result = Curl_rand(data, entropy, 8);
    if(result)
      return result;

    /* 8 bytes random data as challenge in lmresp */
    memcpy(lmresp, entropy, 8);

    /* Pad with zeros */
    memset(lmresp + 8, 0, 0x10);

    /* Fill tmp with challenge(nonce?) + entropy */
    memcpy(tmp, &ntlm->nonce[0], 8);
    memcpy(tmp + 8, entropy, 8);

    Curl_md5it(md5sum, tmp, 16);

    /* We shall only use the first 8 bytes of md5sum, but the des code in
       Curl_ntlm_core_lm_resp only encrypt the first 8 bytes */
    result = Curl_ntlm_core_mk_nt_hash(data, passwdp, ntbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(ntbuffer, md5sum, ntresp);

    /* End of NTLM2 Session code */
    /* NTLM v2 session security is a misnomer because it is not NTLM v2.
       It is NTLM v1 using the extended session security that is also
       in NTLM v2 */
# endif /* defined(USE_NTLM_V2) */
  }
  else
#endif
  {

#ifdef USE_NTRESPONSES
    unsigned char ntbuffer[0x18];
#endif
    unsigned char lmbuffer[0x18];

    /* NTLM version 1 */

#ifdef USE_NTRESPONSES
    result = Curl_ntlm_core_mk_nt_hash(data, passwdp, ntbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(ntbuffer, &ntlm->nonce[0], ntresp);
#endif

    result = Curl_ntlm_core_mk_lm_hash(data, passwdp, lmbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(lmbuffer, &ntlm->nonce[0], lmresp);
    ntlm->flags &= ~NTLMFLAG_NEGOTIATE_NTLM2_KEY;

    /* A safer but less compatible alternative is:
     *   Curl_ntlm_core_lm_resp(ntbuffer, &ntlm->nonce[0], lmresp);
     * See https://davenport.sourceforge.io/ntlm.html#ntlmVersion2 */
  }

  if(unicode) {
    domlen = domlen * 2;
    userlen = userlen * 2;
    hostlen = hostlen * 2;
  }

  lmrespoff = 64; /* size of the message header */
#ifdef USE_NTRESPONSES
  ntrespoff = lmrespoff + 0x18;
  domoff = ntrespoff + ntresplen;
#else
  domoff = lmrespoff + 0x18;
#endif
  useroff = domoff + domlen;
  hostoff = useroff + userlen;

  /* Create the big type-3 message binary blob */
  size = msnprintf((char *)ntlmbuf, NTLM_BUFSIZE,
                   NTLMSSP_SIGNATURE "%c"
                   "\x03%c%c%c"  /* 32-bit type = 3 */

                   "%c%c"  /* LanManager length */
                   "%c%c"  /* LanManager allocated space */
                   "%c%c"  /* LanManager offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* NT-response length */
                   "%c%c"  /* NT-response allocated space */
                   "%c%c"  /* NT-response offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* domain length */
                   "%c%c"  /* domain allocated space */
                   "%c%c"  /* domain name offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* user length */
                   "%c%c"  /* user allocated space */
                   "%c%c"  /* user offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* host length */
                   "%c%c"  /* host allocated space */
                   "%c%c"  /* host offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* session key length (unknown purpose) */
                   "%c%c"  /* session key allocated space (unknown purpose) */
                   "%c%c"  /* session key offset (unknown purpose) */
                   "%c%c"  /* 2 zeroes */

                   "%c%c%c%c",  /* flags */

                   /* domain string */
                   /* user string */
                   /* host string */
                   /* LanManager response */
                   /* NT response */

                   0,                /* zero termination */
                   0, 0, 0,          /* type-3 long, the 24 upper bits */

                   SHORTPAIR(0x18),  /* LanManager response length, twice */
                   SHORTPAIR(0x18),
                   SHORTPAIR(lmrespoff),
                   0x0, 0x0,

#ifdef USE_NTRESPONSES
                   SHORTPAIR(ntresplen),  /* NT-response length, twice */
                   SHORTPAIR(ntresplen),
                   SHORTPAIR(ntrespoff),
                   0x0, 0x0,
#else
                   0x0, 0x0,
                   0x0, 0x0,
                   0x0, 0x0,
                   0x0, 0x0,
#endif
                   SHORTPAIR(domlen),
                   SHORTPAIR(domlen),
                   SHORTPAIR(domoff),
                   0x0, 0x0,

                   SHORTPAIR(userlen),
                   SHORTPAIR(userlen),
                   SHORTPAIR(useroff),
                   0x0, 0x0,

                   SHORTPAIR(hostlen),
                   SHORTPAIR(hostlen),
                   SHORTPAIR(hostoff),
                   0x0, 0x0,

                   0x0, 0x0,
                   0x0, 0x0,
                   0x0, 0x0,
                   0x0, 0x0,

                   LONGQUARTET(ntlm->flags));

  DEBUGASSERT(size == 64);
  DEBUGASSERT(size == (size_t)lmrespoff);

  /* We append the binary hashes */
  if(size < (NTLM_BUFSIZE - 0x18)) {
    memcpy(&ntlmbuf[size], lmresp, 0x18);
    size += 0x18;
  }

  DEBUG_OUT({
    fprintf(stderr, "**** TYPE3 header lmresp=");
    ntlm_print_hex(stderr, (char *)&ntlmbuf[lmrespoff], 0x18);
  });

#ifdef USE_NTRESPONSES
  /* ntresplen + size should not be risking an integer overflow here */
  if(ntresplen + size > sizeof(ntlmbuf)) {
    failf(data, "incoming NTLM message too big");
    return CURLE_OUT_OF_MEMORY;
  }
  DEBUGASSERT(size == (size_t)ntrespoff);
  memcpy(&ntlmbuf[size], ptr_ntresp, ntresplen);
  size += ntresplen;

  DEBUG_OUT({
    fprintf(stderr, "\n   ntresp=");
    ntlm_print_hex(stderr, (char *)&ntlmbuf[ntrespoff], ntresplen);
  });

  free(ntlmv2resp);/* Free the dynamic buffer allocated for NTLMv2 */

#endif

  DEBUG_OUT({
    fprintf(stderr, "\n   flags=0x%02.2x%02.2x%02.2x%02.2x 0x%08.8x ",
            LONGQUARTET(ntlm->flags), ntlm->flags);
    ntlm_print_flags(stderr, ntlm->flags);
    fprintf(stderr, "\n****\n");
  });

  /* Make sure that the domain, user and host strings fit in the
     buffer before we copy them there. */
  if(size + userlen + domlen + hostlen >= NTLM_BUFSIZE) {
    failf(data, "user + domain + host name too big");
    return CURLE_OUT_OF_MEMORY;
  }

  DEBUGASSERT(size == domoff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], domain, domlen / 2);
  else
    memcpy(&ntlmbuf[size], domain, domlen);

  size += domlen;

  DEBUGASSERT(size == useroff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], user, userlen / 2);
  else
    memcpy(&ntlmbuf[size], user, userlen);

  size += userlen;

  DEBUGASSERT(size == hostoff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], host, hostlen / 2);
  else
    memcpy(&ntlmbuf[size], host, hostlen);

  size += hostlen;

  /* Convert domain, user, and host to ASCII but leave the rest as-is */
  result = Curl_convert_to_network(data, (char *)&ntlmbuf[domoff],
                                   size - domoff);
  if(result)
    return CURLE_CONV_FAILED;

  /* Return the binary blob. */
  result = Curl_bufref_memdup(out, ntlmbuf, size);

  Curl_auth_cleanup_ntlm(ntlm);

  return result;
}